

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qasm.cpp
# Opt level: O3

int timings<std::complex<float>>(string *filename,int test)

{
  pointer pcVar1;
  QObject<std::complex<float>_> *pQVar2;
  byte bVar3;
  int iVar4;
  ostream *poVar5;
  pointer puVar6;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  time;
  QCircuit<std::complex<float>,_qclab::QObject<std::complex<float>_>_> circuit;
  stringstream qasm;
  allocator_type local_281;
  TP local_280;
  pointer local_278;
  pointer pcStack_270;
  complex<float> local_268 [3];
  string local_250;
  string local_230;
  string local_210;
  QCircuit<std::complex<float>,_qclab::QObject<std::complex<float>_>_> local_1f0;
  value_type local_1c0;
  vector<std::complex<float>,_std::allocator<std::complex<float>_>_> local_1b8;
  stringstream local_1a0 [16];
  undefined1 local_190 [112];
  ios_base local_120 [264];
  
  local_280.__d.__r = (duration)0;
  pcVar1 = (filename->_M_dataplus)._M_p;
  local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_210,pcVar1,pcVar1 + filename->_M_string_length);
  qclab::QCircuit<std::complex<float>,_qclab::QObject<std::complex<float>_>_>::QCircuit
            (&local_1f0,&local_210,0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringstream::stringstream(local_1a0);
  if (local_1f0.gates_.
      super__Vector_base<std::unique_ptr<qclab::QObject<std::complex<float>_>,_std::default_delete<qclab::QObject<std::complex<float>_>_>_>,_std::allocator<std::unique_ptr<qclab::QObject<std::complex<float>_>,_std::default_delete<qclab::QObject<std::complex<float>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_1f0.gates_.
      super__Vector_base<std::unique_ptr<qclab::QObject<std::complex<float>_>,_std::default_delete<qclab::QObject<std::complex<float>_>_>_>,_std::allocator<std::unique_ptr<qclab::QObject<std::complex<float>_>,_std::default_delete<qclab::QObject<std::complex<float>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      puVar6 = local_1f0.gates_.
               super__Vector_base<std::unique_ptr<qclab::QObject<std::complex<float>_>,_std::default_delete<qclab::QObject<std::complex<float>_>_>_>,_std::allocator<std::unique_ptr<qclab::QObject<std::complex<float>_>,_std::default_delete<qclab::QObject<std::complex<float>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + 1;
      pQVar2 = ((local_1f0.gates_.
                 super__Vector_base<std::unique_ptr<qclab::QObject<std::complex<float>_>,_std::default_delete<qclab::QObject<std::complex<float>_>_>_>,_std::allocator<std::unique_ptr<qclab::QObject<std::complex<float>_>,_std::default_delete<qclab::QObject<std::complex<float>_>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->_M_t).
               super___uniq_ptr_impl<qclab::QObject<std::complex<float>_>,_std::default_delete<qclab::QObject<std::complex<float>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_qclab::QObject<std::complex<float>_>_*,_std::default_delete<qclab::QObject<std::complex<float>_>_>_>
               .super__Head_base<0UL,_qclab::QObject<std::complex<float>_>_*,_false>._M_head_impl;
      iVar4 = (*pQVar2->_vptr_QObject[0xb])(pQVar2,local_190,(ulong)(uint)local_1f0.offset_);
      if (iVar4 != 0) break;
      local_1f0.gates_.
      super__Vector_base<std::unique_ptr<qclab::QObject<std::complex<float>_>,_std::default_delete<qclab::QObject<std::complex<float>_>_>_>,_std::allocator<std::unique_ptr<qclab::QObject<std::complex<float>_>,_std::default_delete<qclab::QObject<std::complex<float>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = puVar6;
    } while (puVar6 != local_1f0.gates_.
                       super__Vector_base<std::unique_ptr<qclab::QObject<std::complex<float>_>,_std::default_delete<qclab::QObject<std::complex<float>_>_>_>,_std::allocator<std::unique_ptr<qclab::QObject<std::complex<float>_>,_std::default_delete<qclab::QObject<std::complex<float>_>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\nqasm:\n",7);
  std::__cxx11::stringbuf::str();
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(char *)local_278,(long)pcStack_270);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  if (local_278 != local_268) {
    operator_delete(local_278,local_268[0]._M_value + 1);
  }
  bVar3 = (byte)local_1f0.nbQubits_ & 0x3f;
  local_278 = (pointer)0x0;
  pcStack_270 = (pointer)0x0;
  local_268[0]._M_value = 0;
  if ((test & 0xfffffffdU) == 1) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"CPU",3);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
    std::ostream::put('h');
    std::ostream::flush();
    local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"  * initialize ket0:","");
    tic(&local_230,&local_280);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._M_dataplus._M_p != &local_230.field_2) {
      operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
    }
    local_1c0._M_value = 0;
    std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::vector
              (&local_1b8,1L << bVar3,&local_1c0,&local_281);
    local_278 = local_1b8.
                super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
                _M_impl.super__Vector_impl_data._M_start;
    pcStack_270 = local_1b8.
                  super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
    local_268[0]._M_value =
         (_ComplexT)
         local_1b8.super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
    (local_1b8.super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
     _M_impl.super__Vector_impl_data._M_start)->_M_value = 0x3f800000;
    toc(&local_280);
    local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_250,"  * simulate qft circuit:","");
    tic(&local_250,&local_280);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._M_dataplus._M_p != &local_250.field_2) {
      operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
    }
    (*local_1f0.super_QObject<std::complex<float>_>._vptr_QObject[8])
              (&local_1f0,0x4e,(ulong)(uint)local_1f0.nbQubits_,&local_278,0);
    toc(&local_280);
    if (local_278 != (pointer)0x0) {
      operator_delete(local_278,local_268[0]._M_value - (long)local_278);
    }
  }
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::ios_base::~ios_base(local_120);
  local_1f0.super_QObject<std::complex<float>_>._vptr_QObject = (_func_int **)&PTR_nbQubits_00138a38
  ;
  std::
  vector<std::unique_ptr<qclab::QObject<std::complex<float>_>,_std::default_delete<qclab::QObject<std::complex<float>_>_>_>,_std::allocator<std::unique_ptr<qclab::QObject<std::complex<float>_>,_std::default_delete<qclab::QObject<std::complex<float>_>_>_>_>_>
  ::~vector(&local_1f0.gates_);
  return 0;
}

Assistant:

int timings( const std::string& filename , const int test ) {

  using R = qclab::real_t< T > ;
  const R tol = 10 * std::numeric_limits< R >::epsilon() ;

  // timing variable
  std::chrono::time_point< std::chrono::high_resolution_clock > time ;

  // quantum circuit
  qclab::QCircuit< T > circuit( filename ) ;
  std::stringstream qasm ;
  circuit.toQASM( qasm ) ;
  std::cout << "\nqasm:\n" << qasm.str() << std::endl ;

  // vector size
  const size_t N = size_t(1) << circuit.nbQubits() ;

  // simulate on CPU
  std::vector< T > psi ;
  if ( test == 1 || test == 3 ) {
    std::cout << "CPU" << std::endl ;
    // all zero state
    tic( "  * initialize ket0:" , time ) ;
    psi = std::vector< T >( N , T(0) ) ;
    psi[0] = 1 ;
    toc( time ) ;
    // simulate
    tic( "  * simulate qft circuit:" , time ) ;
    circuit.simulate( psi ) ;
    toc( time ) ;
  }

  // simulate on GPU
  if ( test == 2 || test == 3 ) {
  #ifdef QCLAB_OMP_OFFLOADING
    std::cout << "GPU" << std::endl ;
    std::vector< T > phi( N ) ; T* phi_ = phi.data() ;
    #pragma omp target enter data map(alloc:phi_[0:N])
    // all zero state
    tic( "  * initialize ket0:" , time ) ;
    #pragma omp target
    {
      phi_[0] = 1 ;
      #pragma omp parallel for
      for ( size_t i = 1; i < N; i++ ) {
        phi_[i] = 0 ;
      }
    }
    toc( time ) ;
    // simulate
    tic( "  * simulate qft circuit:" , time ) ;
    circuit.simulate_device( phi_ ) ;
    toc( time ) ;
    // check
    if ( test == 3 ) {
      #pragma omp target update from(phi_[0:N])
      #pragma omp target exit data map(delete:phi_[0:N])
      for ( size_t i = 0; i < N; i++ ) {
        if ( std::abs( psi[i] - phi[i] ) > tol ) {
          std::cout << " *** CHECK FAILED! ***" << std::endl ;
          return -1 ;
        }
      }
      std::cout << "Check passed." << std::endl ;
    }
  #endif
  }

  // successful
  return 0 ;

}